

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

void __thiscall
duckdb::BaseNumericStatsUnifier<float>::UnifyMinMax
          (BaseNumericStatsUnifier<float> *this,string *new_min,string *new_max)

{
  bool bVar1;
  InternalException *this_00;
  float global_min_val;
  float min_val;
  float local_44;
  string local_40;
  
  if ((new_min->_M_string_length == 4) && (new_max->_M_string_length == 4)) {
    if ((this->super_ColumnStatsUnifier).min_is_set == false) {
      ::std::__cxx11::string::_M_assign((string *)&(this->super_ColumnStatsUnifier).global_min);
      (this->super_ColumnStatsUnifier).min_is_set = true;
    }
    else {
      local_40._M_dataplus._M_p._0_4_ = *(undefined4 *)(new_min->_M_dataplus)._M_p;
      local_44 = *(float *)(this->super_ColumnStatsUnifier).global_min._M_dataplus._M_p;
      bVar1 = GreaterThan::Operation<float>(&local_44,(float *)&local_40);
      if (bVar1) {
        ::std::__cxx11::string::_M_assign((string *)&(this->super_ColumnStatsUnifier).global_min);
      }
    }
    if ((this->super_ColumnStatsUnifier).max_is_set == false) {
      ::std::__cxx11::string::_M_assign((string *)&(this->super_ColumnStatsUnifier).global_max);
      (this->super_ColumnStatsUnifier).max_is_set = true;
    }
    else {
      local_40._M_dataplus._M_p._0_4_ = *(undefined4 *)(new_max->_M_dataplus)._M_p;
      local_44 = *(float *)(this->super_ColumnStatsUnifier).global_max._M_dataplus._M_p;
      bVar1 = GreaterThan::Operation<float>((float *)&local_40,&local_44);
      if (bVar1) {
        ::std::__cxx11::string::_M_assign((string *)&(this->super_ColumnStatsUnifier).global_max);
      }
    }
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Incorrect size for stats in UnifyMinMax","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void UnifyMinMax(const string &new_min, const string &new_max) override {
		if (new_min.size() != sizeof(T) || new_max.size() != sizeof(T)) {
			throw InternalException("Incorrect size for stats in UnifyMinMax");
		}
		if (!min_is_set) {
			global_min = new_min;
			min_is_set = true;
		} else {
			auto min_val = Load<T>(const_data_ptr_cast(new_min.data()));
			auto global_min_val = Load<T>(const_data_ptr_cast(global_min.data()));
			if (LessThan::Operation(min_val, global_min_val)) {
				global_min = new_min;
			}
		}
		if (!max_is_set) {
			global_max = new_max;
			max_is_set = true;
		} else {
			auto max_val = Load<T>(const_data_ptr_cast(new_max.data()));
			auto global_max_val = Load<T>(const_data_ptr_cast(global_max.data()));
			if (GreaterThan::Operation(max_val, global_max_val)) {
				global_max = new_max;
			}
		}
	}